

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.h
# Opt level: O0

bool __thiscall
wallet::DatabaseBatch::Write<Span<std::byte_const>,Span<std::byte_const>>
          (DatabaseBatch *this,Span<const_std::byte> *key,Span<const_std::byte> *value,
          bool fOverwrite)

{
  byte bVar1;
  byte in_CL;
  long *in_RDI;
  long in_FS_OFFSET;
  DataStream ssValue;
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff58;
  Span<const_std::byte> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff58);
  DataStream::reserve(in_stack_ffffffffffffff58,0xb0b671);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  DataStream::DataStream(in_stack_ffffffffffffff58);
  DataStream::reserve(in_stack_ffffffffffffff58,0xb0b6b2);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  bVar1 = (**(code **)(*in_RDI + 8))(in_RDI,&local_28,&local_48,in_CL & 1);
  DataStream::~DataStream(in_stack_ffffffffffffff58);
  DataStream::~DataStream(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Write(const K& key, const T& value, bool fOverwrite = true)
    {
        DataStream ssKey{};
        ssKey.reserve(1000);
        ssKey << key;

        DataStream ssValue{};
        ssValue.reserve(10000);
        ssValue << value;

        return WriteKey(std::move(ssKey), std::move(ssValue), fOverwrite);
    }